

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DelaySyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,ExpressionSyntax *args_2)

{
  SyntaxKind SVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  DelaySyntax *pDVar7;
  
  pDVar7 = (DelaySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DelaySyntax *)this->endPtr < pDVar7 + 1) {
    pDVar7 = (DelaySyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pDVar7 + 1);
  }
  SVar1 = *args;
  TVar3 = args_1->kind;
  uVar4 = args_1->field_0x2;
  NVar5.raw = (args_1->numFlags).raw;
  uVar6 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pDVar7->super_TimingControlSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar7->super_TimingControlSyntax).super_SyntaxNode.kind = SVar1;
  (pDVar7->hash).kind = TVar3;
  (pDVar7->hash).field_0x2 = uVar4;
  (pDVar7->hash).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar7->hash).rawLen = uVar6;
  (pDVar7->hash).info = pIVar2;
  (pDVar7->delayValue).ptr = args_2;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pDVar7;
  return pDVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }